

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalKdevelopGenerator::CreateNewProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  cmMakefile *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *content;
  char *__end;
  cmGeneratedFileStream devses;
  cmXMLWriter sesxml;
  string primaryLanguage;
  cmGeneratedFileStream fout;
  cmXMLWriter local_5e0;
  char cStack_589;
  undefined1 local_588 [32];
  byte abStack_568 [552];
  string local_340;
  cmGlobalKdevelopGenerator *local_320;
  undefined1 local_318 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string *local_2a8;
  string *local_2a0;
  string local_298;
  undefined1 local_278 [584];
  
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false,None);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) != 0)
  goto LAB_0037f15b;
  local_320 = this;
  local_2a8 = cmakeFilePattern;
  local_2a0 = executable;
  cmXMLWriter::cmXMLWriter(&local_5e0,(ostream *)local_278,0);
  local_588._0_8_ = local_588 + 0x10;
  pcVar2 = (projectDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_588,pcVar2,pcVar2 + projectDir->_M_string_length);
  std::__cxx11::string::append(local_588);
  bVar4 = cmsys::SystemTools::FileExists((char *)local_588._0_8_);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  pcVar2 = (projectDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_588,pcVar2,pcVar2 + projectDir->_M_string_length);
  std::__cxx11::string::append(local_588);
  bVar5 = cmsys::SystemTools::FileExists((char *)local_588._0_8_);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  pcVar3 = (local_320->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"C","");
  cStack_589 = bVar5;
  bVar6 = cmGlobalGenerator::GetLanguageEnabled(pcVar3,(string *)local_588);
  bVar5 = true;
  if (!bVar6) {
    pcVar3 = (local_320->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CXX","");
    bVar5 = cmGlobalGenerator::GetLanguageEnabled(pcVar3,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  pcVar3 = (local_320->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"Fortran","");
  bVar6 = cmGlobalGenerator::GetLanguageEnabled(pcVar3,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"C++","");
  if (bVar6 && bVar5 == false) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_2c8,0,(char *)local_2c8._M_string_length,0x5623c5);
  }
  cmXMLWriter::StartDocument(&local_5e0,"UTF-8");
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"kdevelop","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"general","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"author","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[1]>(&local_5e0,(char (*) [1])0x57d84e);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"email","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[1]>(&local_5e0,(char (*) [1])0x57d84e);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"version","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[10]>(&local_5e0,(char (*) [10])"$VERSION$");
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"projectmanagement","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[18]>(&local_5e0,(char (*) [18])"KDevCustomProject");
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"primarylanguage","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5e0,&local_2c8);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Element(&local_5e0,"ignoreparts");
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"projectdirectory","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5e0,projectDir);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"absoluteprojectpath","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"secondaryLanguages","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  if ((bVar5 & bVar6) == 1) {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"language","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[8]>(&local_5e0,(char (*) [8])0x575acf);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
  }
  if (bVar5 != false) {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"language","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[2]>(&local_5e0,(char (*) [2])0x54a940);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
  }
  cmXMLWriter::EndElement(&local_5e0);
  if (bVar4) {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"versioncontrol","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[15]>(&local_5e0,(char (*) [15])"kdevsubversion");
    cmXMLWriter::EndElement(&local_5e0);
LAB_0037cfba:
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
  }
  else if (cStack_589 != '\0') {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"versioncontrol","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[15]>(&local_5e0,(char (*) [15])"kdevcvsservice");
    cmXMLWriter::EndElement(&local_5e0);
    goto LAB_0037cfba;
  }
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"kdevcustomproject","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"filelistdirectory","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5e0,outputDir);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"run","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"mainprogram","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5e0,local_2a0);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"directoryradio","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[7]>(&local_5e0,(char (*) [7])0x56a60a);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"customdirectory","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5e0,outputDir);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"programargs","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[1]>(&local_5e0,(char (*) [1])0x57d84e);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"terminal","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"autocompile","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Element(&local_5e0,"envvars");
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"build","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"buildtool","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56e9a5);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"builddir","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5e0,outputDir);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"make","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"abortonerror","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"numberofjobs","");
  local_318._0_4_ = 1;
  cmXMLWriter::Element<int>(&local_5e0,(string *)local_588,(int *)local_318);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"dontact","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"makebin","");
  this_00 = (*(((local_320->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
              LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  local_318._0_8_ = local_318 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"CMAKE_MAKE_PROGRAM","");
  local_340._M_dataplus._M_p = cmMakefile::GetRequiredDefinition(this_00,(string *)local_318);
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char_const*>(&local_5e0,(char **)&local_340);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"selectedenvironment","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[8]>(&local_5e0,(char (*) [8])0x59325f);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"environments","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"default","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"envvar","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_4_ = 1;
  cmXMLWriter::Attribute<int>(&local_5e0,"value",(int *)local_588);
  cmXMLWriter::Attribute<char[8]>(&local_5e0,"name",(char (*) [8])0x55685b);
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"envvar","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_4_ = 1;
  cmXMLWriter::Attribute<int>(&local_5e0,"value",(int *)local_588);
  cmXMLWriter::Attribute<char[17]>(&local_5e0,"name",(char (*) [17])"CMAKE_NO_VERBOSE");
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"blacklist","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  content = (local_320->Blacklist).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (content !=
      (local_320->Blacklist).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_588._0_8_ = local_588 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"path","");
      cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
      cmXMLWriter::Content<std::__cxx11::string>(&local_5e0,content);
      cmXMLWriter::EndElement(&local_5e0);
      if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
        operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
      }
      content = content + 1;
    } while (content !=
             (local_320->Blacklist).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"kdevfilecreate","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Element(&local_5e0,"filetypes");
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"useglobaltypes","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"type","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[3]>(&local_5e0,"ext",(char (*) [3])0x562894);
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"type","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[4]>(&local_5e0,"ext",(char (*) [4])0x5a002d);
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"type","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[2]>(&local_5e0,"ext",(char (*) [2])0x559c23);
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"kdevdoctreeview","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"projectdoc","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"userdocDir","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])"html/");
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"apidocDir","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])"html/");
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::Element(&local_5e0,"ignoreqt_xml");
  cmXMLWriter::Element(&local_5e0,"ignoredoxygen");
  cmXMLWriter::Element(&local_5e0,"ignorekdocs");
  cmXMLWriter::Element(&local_5e0,"ignoretocs");
  cmXMLWriter::Element(&local_5e0,"ignoredevhelp");
  cmXMLWriter::EndElement(&local_5e0);
  if (bVar5 != false) {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"cppsupportpart","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"filetemplates","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"interfacesuffix","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[3]>(&local_5e0,(char (*) [3])0x55279f);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"implementationsuffix","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x5a002c);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    cmXMLWriter::EndElement(&local_5e0);
    cmXMLWriter::EndElement(&local_5e0);
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"kdevcppsupport","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"codecompletion","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"includeGlobalFunctions","")
    ;
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"includeTypes","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"includeEnums","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"includeTypedefs","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_588,"automaticCodeCompletion","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"automaticArgumentsHint","")
    ;
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_588,"automaticHeaderCompletion","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"codeCompletionDelay","");
    local_318._0_4_ = 0xfa;
    cmXMLWriter::Element<int>(&local_5e0,(string *)local_588,(int *)local_318);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"argumentsHintDelay","");
    local_318._0_4_ = 400;
    cmXMLWriter::Element<int>(&local_5e0,(string *)local_588,(int *)local_318);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"headerCompletionDelay","");
    local_318._0_4_ = 0xfa;
    cmXMLWriter::Element<int>(&local_5e0,(string *)local_588,(int *)local_318);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    cmXMLWriter::EndElement(&local_5e0);
    cmXMLWriter::Element(&local_5e0,"references");
    cmXMLWriter::EndElement(&local_5e0);
  }
  if (bVar6) {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"kdevfortransupport","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"ftnchek","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"division","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"extern","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"declare","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"pure","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"argumentsall","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"commonall","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"truncationall","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"usageall","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"f77all","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"portabilityall","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    cmXMLWriter::Content<char[6]>(&local_5e0,(char (*) [6])0x56d69a);
    cmXMLWriter::EndElement(&local_5e0);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    cmXMLWriter::Element(&local_5e0,"argumentsonly");
    cmXMLWriter::Element(&local_5e0,"commononly");
    cmXMLWriter::Element(&local_5e0,"truncationonly");
    cmXMLWriter::Element(&local_5e0,"usageonly");
    cmXMLWriter::Element(&local_5e0,"f77only");
    cmXMLWriter::Element(&local_5e0,"portabilityonly");
    cmXMLWriter::EndElement(&local_5e0);
    cmXMLWriter::EndElement(&local_5e0);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"kdevfileview","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"groups","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"group","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(&local_5e0,"pattern",local_2a8);
  cmXMLWriter::Attribute<char[6]>(&local_5e0,"name",(char (*) [6])0x549e18);
  cmXMLWriter::EndElement(&local_5e0);
  if (bVar5 != false) {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"group","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[16]>(&local_5e0,"pattern",(char (*) [16])"*.h;*.hxx;*.hpp");
    cmXMLWriter::Attribute<char[7]>(&local_5e0,"name",(char (*) [7])0x56aa92);
    cmXMLWriter::EndElement(&local_5e0);
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"group","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[4]>(&local_5e0,"pattern",(char (*) [4])"*.c");
    cmXMLWriter::Attribute<char[10]>(&local_5e0,"name",(char (*) [10])"C Sources");
    cmXMLWriter::EndElement(&local_5e0);
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"group","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[21]>(&local_5e0,"pattern",(char (*) [21])"*.cpp;*.C;*.cxx;*.cc");
    cmXMLWriter::Attribute<char[12]>(&local_5e0,"name",(char (*) [12])"C++ Sources");
    cmXMLWriter::EndElement(&local_5e0);
  }
  if (bVar6) {
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"group","");
    cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
    if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
      operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[50]>
              (&local_5e0,"pattern",
               (char (*) [50])"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
    cmXMLWriter::Attribute<char[16]>(&local_5e0,"name",(char (*) [16])"Fortran Sources");
    cmXMLWriter::EndElement(&local_5e0);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"group","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[5]>(&local_5e0,"pattern",(char (*) [5])"*.ui");
  cmXMLWriter::Attribute<char[18]>(&local_5e0,"name",(char (*) [18])"Qt Designer files");
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"hidenonprojectfiles","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5e0);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"tree","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"hidepatterns","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[23]>(&local_5e0,(char (*) [23])"*.o,*.lo,CVS,*~,cmake*");
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"hidenonprojectfiles","");
  cmXMLWriter::StartElement(&local_5e0,(string *)local_588);
  cmXMLWriter::Content<char[5]>(&local_5e0,(char (*) [5])0x56460f);
  cmXMLWriter::EndElement(&local_5e0);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndElement(&local_5e0);
  cmXMLWriter::EndDocument(&local_5e0);
  if (sessionFilename->_M_string_length != 0) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_588,(sessionFilename->_M_dataplus)._M_p,false,None);
    if ((abStack_568[*(long *)(local_588._0_8_ + -0x18)] & 5) == 0) {
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_318,(ostream *)local_588,0);
      cmXMLWriter::StartDocument((cmXMLWriter *)local_318,"UTF-8");
      cmXMLWriter::Doctype((cmXMLWriter *)local_318,"KDevPrjSession");
      paVar1 = &local_340.field_2;
      local_340._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"KDevPrjSession","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_318,&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar1) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      local_340._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"DocsAndViews","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_318,&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar1) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      local_340._M_dataplus._M_p._0_4_ = 1;
      cmXMLWriter::Attribute<int>((cmXMLWriter *)local_318,"NumberOfDocuments",(int *)&local_340);
      local_340._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Doc0","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_318,&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar1) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      local_340._M_dataplus._M_p._0_4_ = 1;
      cmXMLWriter::Attribute<int>((cmXMLWriter *)local_318,"NumberOfViews",(int *)&local_340);
      std::operator+(&local_340,"file://",fileToOpen);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_318,"URL",&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar1) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      local_340._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"View0","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_318,&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar1) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      local_340._M_dataplus._M_p = local_340._M_dataplus._M_p & 0xffffffff00000000;
      cmXMLWriter::Attribute<int>((cmXMLWriter *)local_318,"line",(int *)&local_340);
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_318,"Type",(char (*) [7])0x56c437);
      cmXMLWriter::EndElement((cmXMLWriter *)local_318);
      cmXMLWriter::EndElement((cmXMLWriter *)local_318);
      cmXMLWriter::EndElement((cmXMLWriter *)local_318);
      cmXMLWriter::EndElement((cmXMLWriter *)local_318);
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_318);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_588);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::~cmXMLWriter(&local_5e0);
LAB_0037f15b:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::CreateNewProjectFile(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& filename, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen,
  const std::string& sessionFilename)
{
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  // check for a version control system
  bool hasSvn = cmSystemTools::FileExists((projectDir + "/.svn").c_str());
  bool hasCvs = cmSystemTools::FileExists((projectDir + "/CVS").c_str());

  bool enableCxx = (this->GlobalGenerator->GetLanguageEnabled("C") ||
                    this->GlobalGenerator->GetLanguageEnabled("CXX"));
  bool enableFortran = this->GlobalGenerator->GetLanguageEnabled("Fortran");
  std::string primaryLanguage = "C++";
  if (enableFortran && !enableCxx) {
    primaryLanguage = "Fortran77";
  }

  xml.StartDocument();
  xml.StartElement("kdevelop");
  xml.StartElement("general");

  xml.Element("author", "");
  xml.Element("email", "");
  xml.Element("version", "$VERSION$");
  xml.Element("projectmanagement", "KDevCustomProject");
  xml.Element("primarylanguage", primaryLanguage);
  xml.Element("ignoreparts");
  xml.Element("projectdirectory", projectDir); // this one is important
  xml.Element("absoluteprojectpath", "true");  // and this one

  // setup additional languages
  xml.StartElement("secondaryLanguages");
  if (enableFortran && enableCxx) {
    xml.Element("language", "Fortran");
  }
  if (enableCxx) {
    xml.Element("language", "C");
  }
  xml.EndElement();

  if (hasSvn) {
    xml.Element("versioncontrol", "kdevsubversion");
  } else if (hasCvs) {
    xml.Element("versioncontrol", "kdevcvsservice");
  }

  xml.EndElement(); // general
  xml.StartElement("kdevcustomproject");

  xml.Element("filelistdirectory", outputDir);

  xml.StartElement("run");
  xml.Element("mainprogram", executable);
  xml.Element("directoryradio", "custom");
  xml.Element("customdirectory", outputDir);
  xml.Element("programargs", "");
  xml.Element("terminal", "false");
  xml.Element("autocompile", "true");
  xml.Element("envvars");
  xml.EndElement();

  xml.StartElement("build");
  xml.Element("buildtool", "make");   // this one is important
  xml.Element("builddir", outputDir); // and this one
  xml.EndElement();

  xml.StartElement("make");
  xml.Element("abortonerror", "false");
  xml.Element("numberofjobs", 1);
  xml.Element("dontact", "false");
  xml.Element("makebin", this->GlobalGenerator->GetLocalGenerators()[0]
                           ->GetMakefile()
                           ->GetRequiredDefinition("CMAKE_MAKE_PROGRAM"));
  xml.Element("selectedenvironment", "default");

  xml.StartElement("environments");
  xml.StartElement("default");

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "VERBOSE");
  xml.EndElement();

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "CMAKE_NO_VERBOSE");
  xml.EndElement();

  xml.EndElement(); // default
  xml.EndElement(); // environments
  xml.EndElement(); // make

  xml.StartElement("blacklist");
  for (std::vector<std::string>::const_iterator dirIt =
         this->Blacklist.begin();
       dirIt != this->Blacklist.end(); ++dirIt) {
    xml.Element("path", *dirIt);
  }
  xml.EndElement();

  xml.EndElement(); // kdevcustomproject

  xml.StartElement("kdevfilecreate");
  xml.Element("filetypes");
  xml.StartElement("useglobaltypes");

  xml.StartElement("type");
  xml.Attribute("ext", "ui");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "cpp");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "h");
  xml.EndElement();

  xml.EndElement(); // useglobaltypes
  xml.EndElement(); // kdevfilecreate

  xml.StartElement("kdevdoctreeview");
  xml.StartElement("projectdoc");
  xml.Element("userdocDir", "html/");
  xml.Element("apidocDir", "html/");
  xml.EndElement(); // projectdoc
  xml.Element("ignoreqt_xml");
  xml.Element("ignoredoxygen");
  xml.Element("ignorekdocs");
  xml.Element("ignoretocs");
  xml.Element("ignoredevhelp");
  xml.EndElement(); // kdevdoctreeview;

  if (enableCxx) {
    xml.StartElement("cppsupportpart");
    xml.StartElement("filetemplates");
    xml.Element("interfacesuffix", ".h");
    xml.Element("implementationsuffix", ".cpp");
    xml.EndElement(); // filetemplates
    xml.EndElement(); // cppsupportpart

    xml.StartElement("kdevcppsupport");
    xml.StartElement("codecompletion");
    xml.Element("includeGlobalFunctions", "true");
    xml.Element("includeTypes", "true");
    xml.Element("includeEnums", "true");
    xml.Element("includeTypedefs", "false");
    xml.Element("automaticCodeCompletion", "true");
    xml.Element("automaticArgumentsHint", "true");
    xml.Element("automaticHeaderCompletion", "true");
    xml.Element("codeCompletionDelay", 250);
    xml.Element("argumentsHintDelay", 400);
    xml.Element("headerCompletionDelay", 250);
    xml.EndElement(); // codecompletion
    xml.Element("references");
    xml.EndElement(); // kdevcppsupport;
  }

  if (enableFortran) {
    xml.StartElement("kdevfortransupport");
    xml.StartElement("ftnchek");
    xml.Element("division", "false");
    xml.Element("extern", "false");
    xml.Element("declare", "false");
    xml.Element("pure", "false");
    xml.Element("argumentsall", "false");
    xml.Element("commonall", "false");
    xml.Element("truncationall", "false");
    xml.Element("usageall", "false");
    xml.Element("f77all", "false");
    xml.Element("portabilityall", "false");
    xml.Element("argumentsonly");
    xml.Element("commononly");
    xml.Element("truncationonly");
    xml.Element("usageonly");
    xml.Element("f77only");
    xml.Element("portabilityonly");
    xml.EndElement(); // ftnchek
    xml.EndElement(); // kdevfortransupport;
  }

  // set up file groups. maybe this can be used with the CMake SOURCE_GROUP()
  // command
  xml.StartElement("kdevfileview");
  xml.StartElement("groups");

  xml.StartElement("group");
  xml.Attribute("pattern", cmakeFilePattern);
  xml.Attribute("name", "CMake");
  xml.EndElement();

  if (enableCxx) {
    xml.StartElement("group");
    xml.Attribute("pattern", "*.h;*.hxx;*.hpp");
    xml.Attribute("name", "Header");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.c");
    xml.Attribute("name", "C Sources");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.cpp;*.C;*.cxx;*.cc");
    xml.Attribute("name", "C++ Sources");
    xml.EndElement();
  }

  if (enableFortran) {
    xml.StartElement("group");
    xml.Attribute("pattern",
                  "*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
    xml.Attribute("name", "Fortran Sources");
    xml.EndElement();
  }

  xml.StartElement("group");
  xml.Attribute("pattern", "*.ui");
  xml.Attribute("name", "Qt Designer files");
  xml.EndElement();

  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // groups

  xml.StartElement("tree");
  xml.Element("hidepatterns", "*.o,*.lo,CVS,*~,cmake*");
  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // tree

  xml.EndElement(); // kdevfileview
  xml.EndElement(); // kdevelop;
  xml.EndDocument();

  if (sessionFilename.empty()) {
    return;
  }

  // and a session file, so that kdevelop opens a file if it opens the
  // project the first time
  cmGeneratedFileStream devses(sessionFilename.c_str());
  if (!devses) {
    return;
  }
  cmXMLWriter sesxml(devses);
  sesxml.StartDocument("UTF-8");
  sesxml.Doctype("KDevPrjSession");
  sesxml.StartElement("KDevPrjSession");

  sesxml.StartElement("DocsAndViews");
  sesxml.Attribute("NumberOfDocuments", 1);

  sesxml.StartElement("Doc0");
  sesxml.Attribute("NumberOfViews", 1);
  sesxml.Attribute("URL", "file://" + fileToOpen);

  sesxml.StartElement("View0");
  sesxml.Attribute("line", 0);
  sesxml.Attribute("Type", "Source");
  sesxml.EndElement(); // View0

  sesxml.EndElement(); // Doc0
  sesxml.EndElement(); // DocsAndViews
  sesxml.EndElement(); // KDevPrjSession;
}